

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::True(Assert *this,bool expr)

{
  allocator local_39;
  string local_38 [39];
  byte local_11;
  Assert *pAStack_10;
  bool expr_local;
  Assert *this_local;
  
  local_11 = expr;
  pAStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  True(this,(string *)local_38,(bool)(local_11 & 1));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void True(bool expr) const
        {
            True("", expr);
        }